

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

char * __thiscall kj::Path::basename(Path *this,char *__filename)

{
  undefined8 *puVar1;
  long lVar2;
  String *pSVar3;
  long lVar4;
  Fault f;
  Array<kj::String> result;
  
  if (*(long *)(__filename + 8) != 0) {
    pSVar3 = _::HeapArrayDisposer::allocateUninitialized<kj::String>(1);
    lVar2 = *(long *)__filename;
    lVar4 = *(long *)(__filename + 8) * 0x18;
    (pSVar3->content).ptr = *(char **)(lVar2 + -0x18 + lVar4);
    (pSVar3->content).size_ = *(size_t *)(lVar2 + -0x10 + lVar4);
    (pSVar3->content).disposer = *(ArrayDisposer **)(lVar2 + -8 + lVar4);
    puVar1 = (undefined8 *)(lVar2 + -0x18 + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    result.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    f.exception = (Exception *)0x0;
    (this->parts).ptr = pSVar3;
    (this->parts).size_ = 1;
    (this->parts).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    result.ptr = (String *)0x0;
    result.size_ = 0;
    Array<kj::String>::~Array(&result);
    ArrayBuilder<kj::String>::dispose((ArrayBuilder<kj::String> *)&f);
    return (char *)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x74,FAILED,"parts.size() > 0","\"root path has no basename\"",
             (char (*) [26])"root path has no basename");
  _::Debug::Fault::fatal(&f);
}

Assistant:

Path Path::basename() && {
  KJ_REQUIRE(parts.size() > 0, "root path has no basename");
  auto newParts = kj::heapArrayBuilder<String>(1);
  newParts.add(kj::mv(parts[parts.size() - 1]));
  return Path(newParts.finish(), ALREADY_CHECKED);
}